

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_object_preventExtensions
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int reflect)

{
  int64_t iVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  uint uVar5;
  int64_t iVar6;
  JSValue JVar7;
  
  piVar4 = (int *)(argv->u).ptr;
  iVar1 = argv->tag;
  uVar5 = (uint)iVar1;
  if (uVar5 == 0xffffffff) {
    iVar2 = JS_PreventExtensions(ctx,*argv);
    iVar6 = 6;
    if (-1 < iVar2) {
      if (reflect != 0) {
        piVar4 = (int *)(ulong)(iVar2 != 0);
        iVar6 = 1;
        goto LAB_001515a9;
      }
      if (iVar2 != 0) goto LAB_001515c2;
      JS_ThrowTypeError(ctx,"proxy preventExtensions handler returned false");
    }
    piVar4 = (int *)0x0;
    uVar3 = 0;
  }
  else {
    if (reflect == 0) {
      if (0xfffffff4 < uVar5) {
LAB_001515c2:
        *piVar4 = *piVar4 + 1;
      }
      uVar3 = (ulong)piVar4 & 0xffffffff00000000;
      iVar6 = iVar1;
      goto LAB_001515d1;
    }
    JS_ThrowTypeErrorNotAnObject(ctx);
    iVar6 = 6;
    piVar4 = (int *)0x0;
LAB_001515a9:
    uVar3 = 0;
  }
LAB_001515d1:
  JVar7.u.ptr = (void *)((ulong)piVar4 & 0xffffffff | uVar3);
  JVar7.tag = iVar6;
  return JVar7;
}

Assistant:

static JSValue js_object_preventExtensions(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv, int reflect)
{
    JSValueConst obj;
    int ret;

    obj = argv[0];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT) {
        if (reflect)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        else
            return JS_DupValue(ctx, obj);
    }
    ret = JS_PreventExtensions(ctx, obj);
    if (ret < 0)
        return JS_EXCEPTION;
    if (reflect) {
        return JS_NewBool(ctx, ret);
    } else {
        if (!ret)
            return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
        return JS_DupValue(ctx, obj);
    }
}